

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::detail::IEEEFloat::copySignificand(IEEEFloat *this,IEEEFloat *rhs)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint parts;
  Significand *src;
  Significand *dst;
  
  bVar3 = this->field_0x12 & 7;
  if ((bVar3 != 1) && ((this->field_0x12 & 6) == 0 || bVar3 == 3)) {
    __assert_fail("isFiniteNonZero() || category == fcNaN",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x2a8,"void llvm::detail::IEEEFloat::copySignificand(const IEEEFloat &)");
  }
  uVar1 = rhs->semantics->precision;
  uVar2 = this->semantics->precision;
  parts = uVar2 + 0x40 >> 6;
  if (parts <= uVar1 + 0x40 >> 6) {
    if (uVar2 - 0x40 < 0xffffff80) {
      dst = (Significand *)(this->significand).parts;
    }
    else {
      dst = &this->significand;
    }
    if (uVar1 - 0x40 < 0xffffff80) {
      src = (Significand *)(rhs->significand).parts;
    }
    else {
      src = &rhs->significand;
    }
    APInt::tcAssign(&dst->part,&src->part,parts);
    return;
  }
  __assert_fail("rhs.partCount() >= partCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x2a9,"void llvm::detail::IEEEFloat::copySignificand(const IEEEFloat &)");
}

Assistant:

void IEEEFloat::copySignificand(const IEEEFloat &rhs) {
  assert(isFiniteNonZero() || category == fcNaN);
  assert(rhs.partCount() >= partCount());

  APInt::tcAssign(significandParts(), rhs.significandParts(),
                  partCount());
}